

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_boost(envy_bios *bios)

{
  uint8_t uVar1;
  envy_bios_power_boost_entry *peVar2;
  uint16_t *puVar3;
  envy_bios_power_boost_subentry *peVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar6 = (bios->power).boost.offset;
  iVar5 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).boost.version = bios->data[uVar6];
    }
    else {
      (bios->power).boost.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar1 = (bios->power).boost.version;
    if (uVar1 == '\x11') {
      uVar6 = (bios->power).boost.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).boost.hlen = bios->data[uVar6];
        uVar6 = 0;
      }
      else {
        (bios->power).boost.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar6 = 0xfffffff2;
      }
      uVar7 = (bios->power).boost.offset + 2;
      if (uVar7 < bios->length) {
        (bios->power).boost.rlen = bios->data[uVar7];
        uVar7 = 0;
      }
      else {
        (bios->power).boost.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar7 = 0xfffffff2;
      }
      uVar8 = (bios->power).boost.offset + 3;
      if (uVar8 < bios->length) {
        (bios->power).boost.ssz = bios->data[uVar8];
        uVar8 = 0;
      }
      else {
        (bios->power).boost.ssz = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar8 = 0xfffffff2;
      }
      uVar9 = (bios->power).boost.offset + 4;
      if (uVar9 < bios->length) {
        (bios->power).boost.snr = bios->data[uVar9];
        uVar9 = 0;
      }
      else {
        (bios->power).boost.snr = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar9 = 0xfffffff2;
      }
      uVar12 = (bios->power).boost.offset + 5;
      if (uVar12 < bios->length) {
        (bios->power).boost.entriesnum = bios->data[uVar12];
        uVar12 = 0;
      }
      else {
        (bios->power).boost.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar12 = 0xfffffff2;
      }
      uVar12 = uVar7 | uVar6 | uVar8 | uVar9 | uVar12;
    }
    else {
      if (uVar1 != '\x10') {
        fprintf(_stderr,"Unknown BOOST table version 0x%x\n");
        return -0x16;
      }
      uVar6 = (bios->power).boost.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).boost.hlen = bios->data[uVar6];
        uVar6 = 0;
      }
      else {
        (bios->power).boost.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar6 = 0xfffffff2;
      }
      uVar7 = (bios->power).boost.offset + 2;
      if (uVar7 < bios->length) {
        (bios->power).boost.rlen = bios->data[uVar7];
        uVar7 = 0;
      }
      else {
        (bios->power).boost.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar7 = 0xfffffff2;
      }
      uVar8 = (bios->power).boost.offset + 3;
      if (uVar8 < bios->length) {
        (bios->power).boost.entriesnum = bios->data[uVar8];
        uVar12 = 0;
      }
      else {
        (bios->power).boost.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar12 = 0xfffffff2;
      }
      uVar12 = uVar7 | uVar6 | uVar12;
      (bios->power).boost.snr = '\0';
      (bios->power).boost.ssz = '\0';
    }
    (bios->power).boost.valid = uVar12 == 0;
    bVar11 = (bios->power).boost.entriesnum;
    peVar2 = (envy_bios_power_boost_entry *)malloc((ulong)((uint)bVar11 * 8) * 3);
    (bios->power).boost.entries = peVar2;
    if (bVar11 != 0) {
      uVar15 = 0;
      do {
        iVar5 = (uint)(bios->power).boost.hlen + (bios->power).boost.offset;
        iVar10 = (int)uVar15 *
                 ((uint)(bios->power).boost.ssz * (uint)(bios->power).boost.snr +
                 (uint)(bios->power).boost.rlen);
        uVar6 = iVar10 + iVar5 + 1;
        uVar7 = iVar5 + iVar10;
        if (uVar6 < bios->length) {
          bVar11 = (byte)(CONCAT11(bios->data[uVar6],bios->data[uVar7]) >> 5) & 0xf;
        }
        else {
          bVar11 = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar7);
        }
        puVar3 = &(bios->power).boost.entries[uVar15].min;
        if (uVar7 + 3 < bios->length) {
          *puVar3 = CONCAT11(bios->data[uVar7 + 3],bios->data[uVar7 + 2]);
        }
        else {
          *puVar3 = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        }
        puVar3 = &(bios->power).boost.entries[uVar15].max;
        if (uVar7 + 5 < bios->length) {
          *puVar3 = CONCAT11(bios->data[uVar7 + 5],bios->data[uVar7 + 4]);
        }
        else {
          *puVar3 = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        }
        peVar2 = (bios->power).boost.entries;
        peVar2[uVar15].offset = uVar7;
        peVar2[uVar15].pstate = bVar11;
        bVar11 = (bios->power).boost.snr;
        peVar4 = (envy_bios_power_boost_subentry *)malloc((ulong)((uint)bVar11 * 4) * 3);
        peVar2[uVar15].entries = peVar4;
        if (bVar11 != 0) {
          lVar13 = 8;
          uVar14 = 0;
          do {
            peVar4 = (bios->power).boost.entries[uVar15].entries;
            uVar6 = (uint)(bios->power).boost.ssz * (int)uVar14 + (bios->power).boost.rlen + uVar7;
            *(uint *)((long)peVar4 + lVar13 + -8) = uVar6;
            if (uVar6 < bios->length) {
              *(uint8_t *)((long)peVar4 + lVar13 + -4) = bios->data[uVar6];
            }
            else {
              *(undefined1 *)((long)peVar4 + lVar13 + -4) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar6);
            }
            if (uVar6 + 1 < bios->length) {
              *(uint8_t *)((long)peVar4 + lVar13 + -3) = bios->data[uVar6 + 1];
            }
            else {
              *(undefined1 *)((long)peVar4 + lVar13 + -3) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            if (uVar6 + 3 < bios->length) {
              *(ushort *)((long)peVar4 + lVar13 + -2) =
                   CONCAT11(bios->data[uVar6 + 3],bios->data[uVar6 + 2]);
            }
            else {
              *(undefined2 *)((long)peVar4 + lVar13 + -2) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
            if (uVar6 + 5 < bios->length) {
              *(ushort *)((long)&peVar4->offset + lVar13) =
                   CONCAT11(bios->data[uVar6 + 5],bios->data[uVar6 + 4]);
            }
            else {
              *(undefined2 *)((long)&peVar4->offset + lVar13) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
            uVar14 = uVar14 + 1;
            lVar13 = lVar13 + 0xc;
          } while (uVar14 < (bios->power).boost.snr);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (bios->power).boost.entriesnum);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int envy_bios_parse_power_boost(struct envy_bios *bios) {
	struct envy_bios_power_boost *boost = &bios->power.boost;
	int i, j, err = 0;

	if (!boost->offset)
		return -EINVAL;

	bios_u8(bios, boost->offset + 0x0, &boost->version);
	switch(boost->version) {
	case 0x10:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->entriesnum);
		boost->ssz = 0;
		boost->snr = 0;
		boost->valid = !err;
		break;
	case 0x11:
		err |= bios_u8(bios, boost->offset + 0x1, &boost->hlen);
		err |= bios_u8(bios, boost->offset + 0x2, &boost->rlen);
		err |= bios_u8(bios, boost->offset + 0x3, &boost->ssz);
		err |= bios_u8(bios, boost->offset + 0x4, &boost->snr);
		err |= bios_u8(bios, boost->offset + 0x5, &boost->entriesnum);
		boost->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown BOOST table version 0x%x\n", boost->version);
		return -EINVAL;
	};

	boost->entries = malloc(boost->entriesnum * sizeof(struct envy_bios_power_boost_entry));

	for (i = 0; i < boost->entriesnum; i++) {
		uint32_t data = boost->offset + boost->hlen + i * (boost->rlen + (boost->snr * boost->ssz));

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);
		err |= bios_u16(bios, data + 0x2, &boost->entries[i].min);
		err |= bios_u16(bios, data + 0x4, &boost->entries[i].max);

		boost->entries[i].offset = data;
		boost->entries[i].pstate = (tmp & 0x01e0) >> 5;

		boost->entries[i].entries = malloc(boost->snr * sizeof(struct envy_bios_power_boost_subentry));

		for (j = 0; j < boost->snr; j++) {
			struct envy_bios_power_boost_subentry *sub = &boost->entries[i].entries[j];
			uint32_t sdata = data + boost->rlen + j * boost->ssz;

			sub->offset = sdata;
			bios_u8(bios, sdata + 0x0, &sub->domain);
			bios_u8(bios, sdata + 0x1, &sub->percent);
			bios_u16(bios, sdata + 0x2, &sub->min);
			bios_u16(bios, sdata + 0x4, &sub->max);
		}
	}

	return 0;
}